

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O2

bool spvtools::opt::anon_unknown_7::ReplaceTimeAMD
               (IRContext *ctx,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  initializer_list<unsigned_int> init_list;
  uint32_t local_c4;
  Operand local_c0;
  SmallVector<unsigned_int,_2UL> local_90;
  OperandList args;
  InstructionBuilder ir_builder;
  
  InstructionBuilder::InstructionBuilder
            (&ir_builder,ctx,inst,kAnalysisInstrToBlockMapping|kAnalysisBegin);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"SPV_KHR_shader_clock",(allocator<char> *)&local_90);
  IRContext::AddExtension(ctx,(string *)&local_c0);
  std::__cxx11::string::_M_dispose();
  IRContext::AddCapability(ctx,CapabilityShaderClockKHR);
  inst->opcode_ = OpReadClockKHR;
  args.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  args.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  args.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c4 = InstructionBuilder::GetUintConstantId(&ir_builder,3);
  init_list._M_len = 1;
  init_list._M_array = &local_c4;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_90,init_list);
  local_c0.type = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c0.words,&local_90);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&args,&local_c0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c0.words);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_90);
  Instruction::SetInOperands(inst,&args);
  IRContext::UpdateDefUse(ctx,inst);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&args);
  return true;
}

Assistant:

bool ReplaceTimeAMD(IRContext* ctx, Instruction* inst,
                    const std::vector<const analysis::Constant*>&) {
  InstructionBuilder ir_builder(
      ctx, inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  ctx->AddExtension("SPV_KHR_shader_clock");
  ctx->AddCapability(spv::Capability::ShaderClockKHR);

  inst->SetOpcode(spv::Op::OpReadClockKHR);
  Instruction::OperandList args;
  uint32_t subgroup_scope_id =
      ir_builder.GetUintConstantId(uint32_t(spv::Scope::Subgroup));
  args.push_back({SPV_OPERAND_TYPE_ID, {subgroup_scope_id}});
  inst->SetInOperands(std::move(args));
  ctx->UpdateDefUse(inst);

  return true;
}